

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

treeNode * factor(void)

{
  bool bVar1;
  treeNode *extraout_RAX;
  treeNode *ptVar2;
  double __x;
  allocator local_49;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,"(",&local_49);
  bVar1 = match(&local_28,Empty);
  __x = (double)std::__cxx11::string::~string((string *)&local_28);
  if (bVar1) {
    exp(__x);
    std::__cxx11::string::string((string *)&local_48,")",&local_49);
    match(&local_48,lackRightBucket);
    std::__cxx11::string::~string((string *)&local_48);
    ptVar2 = extraout_RAX;
  }
  else {
    bVar1 = std::operator==(&nextToken.text,"false");
    if (((bVar1) || (bVar1 = std::operator==(&nextToken.text,"true"), bVar1)) ||
       (nextToken.kind - Integer < 4)) {
      ptVar2 = constVal();
    }
    else {
      ptVar2 = identifiderExp();
    }
  }
  return ptVar2;
}

Assistant:

treeNode* factor()
{
    if(match("("))
    {
        treeNode* ret=exp();
        match(")",Error::lackRightBucket);
        return ret;
    }
    else if(nextToken.text=="false"||nextToken.text=="true"||nextToken.kind==Token::Integer||nextToken.kind==Token::String||nextToken.kind==Token::Char||nextToken.kind==Token::Demical)
    {
        return constVal();
    }
    else
    {
        return identifiderExp();
    }
}